

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O0

int __thiscall IfNeuron::addStimulus(IfNeuron *this,StochasticVariable *stochvar)

{
  int iVar1;
  Scalar *this_00;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  StochasticVariable *local_18;
  StochasticVariable *stochvar_local;
  IfNeuron *this_local;
  
  local_18 = stochvar;
  stochvar_local = (StochasticVariable *)this;
  this_00 = (Scalar *)operator_new(0x150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"1.0",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Scalar",&local_71);
  Scalar::Scalar(this_00,1.0,&local_38,&local_70);
  iVar1 = DifferentialEquation::addTerm
                    (&this->ifneuronMembrane,(StochasticFunction *)this_00,local_18);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return iVar1;
}

Assistant:

int IfNeuron::addStimulus( StochasticVariable *stochvar )
{
	return ifneuronMembrane.addTerm( new Scalar( 1.0, "1.0" ), stochvar );
}